

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_SetLastCutContainsArea(Of_Cut_t **pCuts,int nCuts)

{
  Of_Cut_t *pOVar1;
  bool bVar2;
  int iVar3;
  Of_Cut_t *t;
  int fChanges;
  int k;
  int i;
  int nCuts_local;
  Of_Cut_t **pCuts_local;
  
  bVar2 = false;
  for (fChanges = 0; fChanges < nCuts; fChanges = fChanges + 1) {
    if (((*(uint *)&pCuts[nCuts]->field_0x10 >> 0x1b < *(uint *)&pCuts[fChanges]->field_0x10 >> 0x1b
         ) && ((pCuts[nCuts]->Sign & pCuts[fChanges]->Sign) == pCuts[nCuts]->Sign)) &&
       (iVar3 = Of_SetCutIsContainedOrder(pCuts[fChanges],pCuts[nCuts]), iVar3 != 0)) {
      *(uint *)&pCuts[fChanges]->field_0x10 =
           *(uint *)&pCuts[fChanges]->field_0x10 & 0x7ffffff | 0xf8000000;
      bVar2 = true;
    }
  }
  pCuts_local._4_4_ = nCuts;
  if (bVar2) {
    t._4_4_ = 0;
    for (fChanges = 0; fChanges <= nCuts; fChanges = fChanges + 1) {
      if (*(uint *)&pCuts[fChanges]->field_0x10 >> 0x1b != 0x1f) {
        if (t._4_4_ < fChanges) {
          pOVar1 = pCuts[t._4_4_];
          pCuts[t._4_4_] = pCuts[fChanges];
          pCuts[fChanges] = pOVar1;
        }
        t._4_4_ = t._4_4_ + 1;
      }
    }
    pCuts_local._4_4_ = t._4_4_ + -1;
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Of_SetLastCutContainsArea( Of_Cut_t ** pCuts, int nCuts )
{
    int i, k, fChanges = 0;
    for ( i = 0; i < nCuts; i++ )
        if ( pCuts[nCuts]->nLeaves < pCuts[i]->nLeaves && (pCuts[nCuts]->Sign & pCuts[i]->Sign) == pCuts[nCuts]->Sign && Of_SetCutIsContainedOrder(pCuts[i], pCuts[nCuts]) )
            pCuts[i]->nLeaves = OF_NO_LEAF, fChanges = 1;
    if ( !fChanges )
        return nCuts;
    for ( i = k = 0; i <= nCuts; i++ )
    {
        if ( pCuts[i]->nLeaves == OF_NO_LEAF )
            continue;
        if ( k < i )
            ABC_SWAP( Of_Cut_t *, pCuts[k], pCuts[i] );
        k++;
    }
    return k - 1;
}